

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int param_copy_gost_ec(EVP_PKEY *to,EVP_PKEY *from)

{
  int iVar1;
  int iVar2;
  EC_KEY *key;
  EC_KEY *key_00;
  EC_GROUP *group;
  BIGNUM *pBVar3;
  
  key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)to);
  key_00 = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)from);
  iVar1 = EVP_PKEY_get_base_id(from);
  iVar2 = EVP_PKEY_get_base_id(to);
  if (iVar1 == iVar2) {
    if (key_00 == (EC_KEY *)0x0) {
      iVar2 = 0x78;
      iVar1 = 0x35c;
    }
    else {
      if (key == (EC_KEY *)0x0) {
        key = EC_KEY_new();
        if (key == (EC_KEY *)0x0) {
          iVar2 = 0xc0100;
          iVar1 = 0x362;
          goto LAB_0010edfa;
        }
        iVar1 = EVP_PKEY_get_base_id(from);
        iVar1 = EVP_PKEY_assign((EVP_PKEY *)to,iVar1,key);
        if (iVar1 == 0) {
          ERR_GOST_error(0x77,0xc0103,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                         ,0x366);
          EC_KEY_free(key);
          return 0;
        }
      }
      group = EC_KEY_get0_group(key_00);
      iVar1 = EC_KEY_set_group(key,group);
      if (iVar1 != 0) {
        pBVar3 = EC_KEY_get0_private_key(key);
        if (pBVar3 != (BIGNUM *)0x0) {
          iVar1 = gost_ec_compute_public((EC_KEY *)key);
          return iVar1;
        }
        return 1;
      }
      iVar2 = 0xc0103;
      iVar1 = 0x36c;
    }
  }
  else {
    iVar2 = 0x6c;
    iVar1 = 0x358;
  }
LAB_0010edfa:
  ERR_GOST_error(0x77,iVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ameth.c"
                 ,iVar1);
  return 0;
}

Assistant:

static int param_copy_gost_ec(EVP_PKEY *to, const EVP_PKEY *from)
{
    EC_KEY *eto = EVP_PKEY_get0(to);
    const EC_KEY *efrom = EVP_PKEY_get0((EVP_PKEY *)from);
    if (EVP_PKEY_base_id(from) != EVP_PKEY_base_id(to)) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, GOST_R_INCOMPATIBLE_ALGORITHMS);
        return 0;
    }
    if (!efrom) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, GOST_R_KEY_PARAMETERS_MISSING);
        return 0;
    }
    if (!eto) {
        eto = EC_KEY_new();
        if (!eto) {
            GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        if (!EVP_PKEY_assign(to, EVP_PKEY_base_id(from), eto)) {
            GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_INTERNAL_ERROR);
            EC_KEY_free(eto);
            return 0;
        }
    }
    if (!EC_KEY_set_group(eto, EC_KEY_get0_group(efrom))) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    if (EC_KEY_get0_private_key(eto)) {
        return gost_ec_compute_public(eto);
    }
    return 1;
}